

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O3

void __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
::RangeConstraintConverter
          (RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
           *this,FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *mc)

{
  ValueNode *pVVar1;
  
  (this->
  super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ).mdl_cvt_ = mc;
  pVVar1 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                     (&(mc->
                       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       ).value_presolver_.super_ValuePresolverImpl.dest_.vars_);
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .
  super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
  .super_BasicLink.value_presolver_ =
       &(mc->
        super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ).value_presolver_;
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .
  super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
  .super_BasicLink._vptr_BasicLink = (_func_int **)&PTR__BasicIndivEntryLink_005cc110;
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .
  super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
  .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  *(size_t *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 8) = 0;
  ((iterator *)
  ((long)&(this->link_rng2slk_).
          super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
          .
          super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
          .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
          _M_impl.super__Deque_impl_data + 0x10))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 0x18) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 0x28) = (_Map_pointer)0x0;
  ((iterator *)
  ((long)&(this->link_rng2slk_).
          super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
          .
          super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
          .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
          _M_impl.super__Deque_impl_data + 0x30))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->link_rng2slk_).
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           .
           super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
           .entries_.super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           ._M_impl.super__Deque_impl_data + 0x48) = (_Map_pointer)0x0;
  std::_Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::_M_initialize_map
            (&(this->link_rng2slk_).
              super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
              .
              super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
              .entries_.
              super__Deque_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,0);
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .ndl_._M_elems[0] =
       &(mc->
        super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ).ck__LinConRange_.super_BasicConstraintKeeper.value_node_;
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .ndl_._M_elems[1] =
       &(mc->
        super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ).ck__LinConEQ_.super_BasicConstraintKeeper.value_node_;
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .ndl_._M_elems[2] = pVVar1;
  (this->link_rng2slk_).
  super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  .
  super_BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
  .super_BasicLink._vptr_BasicLink = (_func_int **)&PTR__BasicIndivEntryLink_005cc028;
  (this->link_rng2slk_).cvt_ = mc;
  return;
}

Assistant:

RangeConstraintConverter(ModelConverter& mc) : Base(mc) { }